

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree *
kj::StringTree::concat<kj::StringPtr>(StringTree *__return_storage_ptr__,StringPtr *params)

{
  char *pcVar1;
  ArrayDisposer *pAVar2;
  Branch *pBVar3;
  size_t sVar4;
  char *__dest;
  String local_28;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  sVar4 = (params->content).size_ - 1;
  __return_storage_ptr__->size_ = sVar4;
  heapString(&local_28,sVar4);
  pcVar1 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar1 != (char *)0x0) {
    sVar4 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar2 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar2->_vptr_ArrayDisposer)(pAVar2,pcVar1,1,sVar4,sVar4,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_28.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_28.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_28.content.disposer;
  local_28.content.ptr =
       (char *)kj::_::HeapArrayDisposer::allocateImpl
                         (0x40,0,0,kj::_::HeapArrayDisposer::
                                   Allocate_<kj::StringTree::Branch,_false,_false>::construct,
                          kj::_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>
                          ::destruct);
  local_28.content.size_ = 0;
  local_28.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pBVar3 = (__return_storage_ptr__->branches).ptr;
  if (pBVar3 != (Branch *)0x0) {
    sVar4 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar2 = (__return_storage_ptr__->branches).disposer;
    (**pAVar2->_vptr_ArrayDisposer)
              (pAVar2,pBVar3,0x40,sVar4,sVar4,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_28.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_28.content.size_;
  (__return_storage_ptr__->branches).disposer = local_28.content.disposer;
  pcVar1 = (params->content).ptr;
  sVar4 = (params->content).size_;
  if (pcVar1 != pcVar1 + (sVar4 - 1)) {
    __dest = (char *)(__return_storage_ptr__->text).content.size_;
    if (__dest != (char *)0x0) {
      __dest = (__return_storage_ptr__->text).content.ptr;
    }
    memcpy(__dest,pcVar1,sVar4 - 1);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}